

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cc
# Opt level: O2

bool leveldb::ParseFileName(string *filename,uint64_t *number,FileType *type)

{
  long lVar1;
  bool bVar2;
  FileType FVar3;
  long in_FS_OFFSET;
  Slice local_70;
  uint64_t num_1;
  Slice local_58;
  uint64_t num;
  size_t sStack_40;
  Slice rest;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  rest.data_ = (filename->_M_dataplus)._M_p;
  rest.size_ = filename->_M_string_length;
  num = (long)"/CURRENT" + 1;
  sStack_40 = 7;
  bVar2 = operator==(&rest,(Slice *)&num);
  if (bVar2) {
    *number = 0;
    *type = kCurrentFile;
  }
  else {
    num = (long)"/LOCK" + 1;
    sStack_40 = 4;
    bVar2 = operator==(&rest,(Slice *)&num);
    if (bVar2) {
      *number = 0;
      *type = kDBLockFile;
    }
    else {
      num = (long)"/LOG" + 1;
      sStack_40 = 3;
      bVar2 = operator==(&rest,(Slice *)&num);
      if (!bVar2) {
        local_58.data_ = "LOG.old";
        local_58.size_ = 7;
        bVar2 = operator==(&rest,&local_58);
        if (!bVar2) {
          num = (uint64_t)anon_var_dwarf_1a931ea;
          sStack_40 = 9;
          bVar2 = Slice::starts_with(&rest,(Slice *)&num);
          if (bVar2) {
            Slice::remove_prefix(&rest,9);
            bVar2 = ConsumeDecimalNumber(&rest,&num);
            if ((!bVar2) || (rest.size_ != 0)) {
LAB_00548e6c:
              bVar2 = false;
              goto LAB_00548d1b;
            }
            *type = kDescriptorFile;
            num_1 = num;
          }
          else {
            bVar2 = ConsumeDecimalNumber(&rest,&num_1);
            if (!bVar2) goto LAB_00548e6c;
            num = (uint64_t)rest.data_;
            sStack_40 = rest.size_;
            local_58.data_ = ".log";
            local_58.size_ = 4;
            bVar2 = operator==((Slice *)&num,&local_58);
            FVar3 = kLogFile;
            if (!bVar2) {
              local_58.data_ = ".sst";
              local_58.size_ = 4;
              bVar2 = operator==((Slice *)&num,&local_58);
              if (!bVar2) {
                local_70.data_ = ".ldb";
                local_70.size_ = 4;
                bVar2 = operator==((Slice *)&num,&local_70);
                if (!bVar2) {
                  local_58.data_ = ".dbtmp";
                  local_58.size_ = 6;
                  bVar2 = operator==((Slice *)&num,&local_58);
                  if (!bVar2) goto LAB_00548e6c;
                  FVar3 = kTempFile;
                  goto LAB_00548e33;
                }
              }
              FVar3 = kTableFile;
            }
LAB_00548e33:
            *type = FVar3;
          }
          *number = num_1;
          goto LAB_00548d19;
        }
      }
      *number = 0;
      *type = kInfoLogFile;
    }
  }
LAB_00548d19:
  bVar2 = true;
LAB_00548d1b:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool ParseFileName(const std::string& filename, uint64_t* number,
                   FileType* type) {
  Slice rest(filename);
  if (rest == "CURRENT") {
    *number = 0;
    *type = kCurrentFile;
  } else if (rest == "LOCK") {
    *number = 0;
    *type = kDBLockFile;
  } else if (rest == "LOG" || rest == "LOG.old") {
    *number = 0;
    *type = kInfoLogFile;
  } else if (rest.starts_with("MANIFEST-")) {
    rest.remove_prefix(strlen("MANIFEST-"));
    uint64_t num;
    if (!ConsumeDecimalNumber(&rest, &num)) {
      return false;
    }
    if (!rest.empty()) {
      return false;
    }
    *type = kDescriptorFile;
    *number = num;
  } else {
    // Avoid strtoull() to keep filename format independent of the
    // current locale
    uint64_t num;
    if (!ConsumeDecimalNumber(&rest, &num)) {
      return false;
    }
    Slice suffix = rest;
    if (suffix == Slice(".log")) {
      *type = kLogFile;
    } else if (suffix == Slice(".sst") || suffix == Slice(".ldb")) {
      *type = kTableFile;
    } else if (suffix == Slice(".dbtmp")) {
      *type = kTempFile;
    } else {
      return false;
    }
    *number = num;
  }
  return true;
}